

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O3

int fp_info_hdu(fitsfile *infptr)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  char *pcVar6;
  int stat;
  int hdutype;
  int naxis;
  unsigned_long hdusum;
  unsigned_long datasum;
  int bitpix;
  char val [81];
  long naxes [9];
  char com [81];
  char msg [513];
  int local_36c;
  int local_368;
  int local_364;
  int local_360 [2];
  undefined8 local_358;
  uint local_34c;
  undefined1 local_348;
  undefined4 local_347;
  char cStack_343;
  undefined1 uStack_342;
  undefined2 uStack_341;
  undefined3 uStack_33f;
  undefined8 local_2e8 [10];
  undefined1 local_298 [96];
  char local_238 [520];
  
  puVar4 = &DAT_0010c160;
  puVar5 = local_2e8;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar5 = *puVar4;
    puVar4 = puVar4 + 1;
    puVar5 = puVar5 + 1;
  }
  local_364 = 0;
  local_36c = 0;
  uVar3 = 1;
  ffmahd(infptr,1,0,&local_36c);
  if (local_36c == 0) {
    while( true ) {
      ffghdt(infptr,&local_368,&local_36c);
      if (local_36c != 0) break;
      ffgkey(infptr,"XTENSION",&local_348,local_298,&local_36c);
      if (local_36c == 0) {
        if (((local_368 == 0) && (cStack_343 != 'E' || local_347 != 0x47414d49)) &&
           (cStack_343 != 'A' || local_347 != 0x544e4942)) {
          local_368 = 3;
        }
      }
      else {
        if (local_36c != 0xca) break;
        local_36c = 0;
      }
      ffgcks(infptr,&local_358,local_360,&local_36c);
      if (local_368 == 2) {
        pcVar6 = "  %d BINARY_TBL";
LAB_00104c2f:
        snprintf(local_238,0x201,pcVar6,uVar3);
        printf("%s",local_238);
        snprintf(local_238,0x201," SUMS=%lu/%lu\n",~(long)local_360[0],local_358);
LAB_00104cd2:
        printf("%s",local_238);
      }
      else {
        if (local_368 == 1) {
          pcVar6 = "  %d ASCII_TBL";
          goto LAB_00104c2f;
        }
        if (local_368 != 0) {
          snprintf(local_238,0x201,"  %d OTHER",uVar3);
          printf("%s",local_238);
          snprintf(local_238,0x201," SUMS=%lu/%lu",~(long)local_360[0],local_358);
          printf("%s",local_238);
          snprintf(local_238,0x201," %s\n",&local_348);
          goto LAB_00104cd2;
        }
        snprintf(local_238,0x201,"  %d IMAGE",uVar3);
        printf("%s",local_238);
        snprintf(local_238,0x201," SUMS=%lu/%lu",~(long)local_360[0],local_358);
        printf("%s",local_238);
        ffgipr(infptr,9,&local_34c,&local_364,local_2e8,&local_36c);
        snprintf(local_238,0x201," BITPIX=%d",(ulong)local_34c);
        printf("%s",local_238);
        if (local_364 == 1) {
          snprintf(local_238,0x201," [%ld]",local_2e8[1]);
LAB_00104d45:
          printf("%s",local_238);
        }
        else {
          if (local_364 == 0) {
            builtin_strncpy(local_238 + 8,"els]",5);
            builtin_strncpy(local_238," [no_pix",8);
            goto LAB_00104d45;
          }
          snprintf(local_238,0x201," [%ld",local_2e8[0]);
          printf("%s",local_238);
          if (1 < local_364) {
            lVar2 = 1;
            do {
              snprintf(local_238,0x201,"x%ld",local_2e8[lVar2]);
              printf("%s",local_238);
              lVar2 = lVar2 + 1;
            } while (lVar2 < local_364);
          }
          putchar(0x5d);
        }
        iVar1 = fits_is_compressed_image(infptr,&local_36c);
        if (iVar1 == 0) {
          pcVar6 = " not_tiled";
        }
        else {
          ffgkey(infptr,"ZCMPTYPE",&local_348,local_298,&local_36c);
          if (CONCAT11(uStack_342,cStack_343) == 0x315f && local_347 == 0x45434952) {
            pcVar6 = " tiled_rice";
          }
          else if (CONCAT11(uStack_342,cStack_343) == 0x315f && local_347 == 0x50495a47) {
            pcVar6 = " tiled_gzip_1";
          }
          else if (CONCAT11(uStack_342,cStack_343) == 0x325f && local_347 == 0x50495a47) {
            pcVar6 = " tiled_gzip_2";
          }
          else if (CONCAT11(uStack_342,cStack_343) == 0x315f && local_347 == 0x4f494c50) {
            pcVar6 = " tiled_plio";
          }
          else if (CONCAT35(uStack_33f,
                            CONCAT23(uStack_341,
                                     CONCAT12(uStack_342,CONCAT11(cStack_343,local_347._3_1_)))) ==
                   0x315f53534552504d &&
                   CONCAT26(uStack_341,CONCAT15(uStack_342,CONCAT14(cStack_343,local_347))) ==
                   0x534552504d4f4348) {
            pcVar6 = " tiled_hcompress";
          }
          else {
            pcVar6 = " unknown";
          }
        }
        puts(pcVar6);
      }
      ffmrhd(infptr,1,0,&local_36c);
      uVar3 = (ulong)((int)uVar3 + 1);
      if (local_36c != 0) {
        return 0;
      }
    }
  }
  fp_abort_output(infptr,(fitsfile *)0x0,local_36c);
}

Assistant:

int fp_info_hdu (fitsfile *infptr)
{
	long	naxes[9] = {1, 1, 1, 1, 1, 1, 1, 1, 1};
	char	msg[SZ_STR], val[SZ_CARD], com[SZ_CARD];
        int     naxis=0, hdutype, bitpix, hdupos, stat=0, ii;
        unsigned long   datasum, hdusum;

	fits_movabs_hdu (infptr, 1, NULL, &stat);
	if (stat) { 
	    fp_abort_output(infptr, NULL, stat);
	}

	for (hdupos=1; ! stat; hdupos++) {
	    fits_get_hdu_type (infptr, &hdutype, &stat);
	    if (stat) { 
	        fp_abort_output(infptr, NULL, stat);
	    }

	    /* fits_get_hdu_type calls unknown extensions "IMAGE_HDU"
	     * so consult XTENSION keyword itself
	     */
	    fits_read_keyword (infptr, "XTENSION", val, com, &stat);
	    if (stat == KEY_NO_EXIST) {
		/* in primary HDU which by definition is an "image" */
		stat=0; /* clear for later error handling */

	    } else if (stat) {
	        fp_abort_output(infptr, NULL, stat);

	    } else if (hdutype == IMAGE_HDU) {
		/* that is, if XTENSION != "IMAGE" AND != "BINTABLE" */
		if (strncmp (val+1, "IMAGE", 5) &&
		    strncmp (val+1, "BINTABLE", 5)) {

		     /* assign something other than any of these */
		    hdutype = IMAGE_HDU + ASCII_TBL + BINARY_TBL;
		}
	    }

            fits_get_chksum(infptr, &datasum, &hdusum, &stat);

	    if (hdutype == IMAGE_HDU) {
		snprintf (msg, SZ_STR,"  %d IMAGE", hdupos); fp_msg (msg);
                snprintf (msg, SZ_STR," SUMS=%lu/%lu", (unsigned long) (~((int) hdusum)), datasum); fp_msg (msg);

		fits_get_img_param (infptr, 9, &bitpix, &naxis, naxes, &stat);

                snprintf (msg, SZ_STR," BITPIX=%d", bitpix); fp_msg (msg);

		if (naxis == 0) {
                    snprintf (msg, SZ_STR," [no_pixels]"); fp_msg (msg);
		} else if (naxis == 1) {
		    snprintf (msg, SZ_STR," [%ld]", naxes[1]); fp_msg (msg);
		} else {
		    snprintf (msg, SZ_STR," [%ld", naxes[0]); fp_msg (msg);
		    for (ii=1; ii < naxis; ii++) {
			snprintf (msg, SZ_STR,"x%ld", naxes[ii]); fp_msg (msg);
		    }
		    fp_msg ("]");
		}

                if (fits_is_compressed_image (infptr, &stat)) {
                    fits_read_keyword (infptr, "ZCMPTYPE", val, com, &stat);

                    /* allow for quote in keyword value */
                    if (! strncmp (val+1, "RICE_1", 6))
                        fp_msg (" tiled_rice\n");
                    else if (! strncmp (val+1, "GZIP_1", 6))
                        fp_msg (" tiled_gzip_1\n");
                    else if (! strncmp (val+1, "GZIP_2", 6))
                        fp_msg (" tiled_gzip_2\n");
                    else if (! strncmp (val+1, "PLIO_1", 6))
                        fp_msg (" tiled_plio\n");
                    else if (! strncmp (val+1, "HCOMPRESS_1", 11))
                        fp_msg (" tiled_hcompress\n");
                    else
                        fp_msg (" unknown\n");

                } else
                    fp_msg (" not_tiled\n");

            } else if (hdutype == ASCII_TBL) {
                snprintf (msg, SZ_STR,"  %d ASCII_TBL", hdupos); fp_msg (msg);
                snprintf (msg, SZ_STR," SUMS=%lu/%lu\n", (unsigned long) (~((int) hdusum)), datasum); fp_msg (msg);

            } else if (hdutype == BINARY_TBL) {
                snprintf (msg, SZ_STR,"  %d BINARY_TBL", hdupos); fp_msg (msg);
                snprintf (msg, SZ_STR," SUMS=%lu/%lu\n", (unsigned long) (~((int) hdusum)), datasum); fp_msg (msg);

            } else {
                snprintf (msg, SZ_STR,"  %d OTHER", hdupos); fp_msg (msg);
                snprintf (msg, SZ_STR," SUMS=%lu/%lu",   (unsigned long) (~((int) hdusum)), datasum); fp_msg (msg);
                snprintf (msg, SZ_STR," %s\n", val); fp_msg (msg);
            }

	    fits_movrel_hdu (infptr, 1, NULL, &stat);
	}
	return(0);
}